

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

QRegion __thiscall QMdiSubWindowPrivate::getRegion(QMdiSubWindowPrivate *this,Operation operation)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QMdiSubWindow *pQVar7;
  QStyle *pQVar8;
  QRegion *other;
  int in_EDX;
  QMdiSubWindowPrivate *in_RSI;
  QStyleOptionTitleBar *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  int i;
  int titleBarConst;
  int cornerConst;
  int frameWidth;
  int titleBarHeight;
  int height;
  int width;
  QMdiSubWindow *q;
  QRegion *region;
  QStyleOptionTitleBar titleBarOptions;
  QWidget *in_stack_fffffffffffffe88;
  QStyleOptionTitleBar *this_00;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int local_150;
  QRegion local_110;
  QRegion local_108;
  QRegion local_100;
  QRegion local_f8;
  QRegion local_f0;
  QRegion local_e8;
  QRegion local_e0;
  QRegion local_d8;
  QRegion local_d0;
  QRegion local_c8;
  QRegion local_c0;
  QRegion local_b8;
  QRegion local_b0;
  QRegion local_a8;
  QRegion local_a0;
  QRegion local_98;
  undefined1 local_90 [16];
  QRegion local_80;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar7 = q_func(in_RSI);
  iVar2 = QWidget::width((QWidget *)0x62ebb5);
  iVar3 = QWidget::height((QWidget *)0x62ebc3);
  iVar4 = QMdiSubWindowPrivate::titleBarHeight
                    ((QMdiSubWindowPrivate *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  pQVar8 = QWidget::style(in_stack_fffffffffffffe88);
  iVar5 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x2c,0,pQVar7);
  iVar6 = iVar4 - iVar5;
  if (in_EDX == 1) {
    memset(local_78,0xaa,0x70);
    QMdiSubWindowPrivate::titleBarOptions((QMdiSubWindowPrivate *)CONCAT44(iVar2,iVar3));
    *(undefined1 **)&(this_00->super_QStyleOptionComplex).super_QStyleOption = &DAT_aaaaaaaaaaaaaaaa
    ;
    QRegion::QRegion((QRegion *)this_00,iVar5,iVar5,iVar2 + iVar5 * -2,iVar6,Rectangle);
    for (local_150 = 0; local_150 < 9; local_150 = local_150 + 1) {
      if (SubControls[local_150] != SC_TitleBarLabel) {
        pQVar8 = QWidget::style(in_stack_fffffffffffffe88);
        auVar9 = (**(code **)(*(long *)pQVar8 + 0xd8))(pQVar8,5,local_78,SubControls[local_150],0);
        local_90 = auVar9;
        QRegion::QRegion(&local_80,(QRect *)local_90,Rectangle);
        QRegion::operator-=((QRegion *)this_00,(QRegion *)&local_80);
        QRegion::~QRegion(&local_80);
      }
    }
    QStyleOptionTitleBar::~QStyleOptionTitleBar(this_00);
  }
  else {
    *(undefined1 **)&(this_00->super_QStyleOptionComplex).super_QStyleOption = &DAT_aaaaaaaaaaaaaaaa
    ;
    QRegion::QRegion((QRegion *)this_00);
    QWidget::style(in_stack_fffffffffffffe88);
    bVar1 = isMacStyle((QStyle *)in_RSI);
    auVar9._8_8_ = local_90._8_8_;
    auVar9._0_8_ = local_90._0_8_;
    if (!bVar1) {
      other = (QRegion *)(ulong)(in_EDX - 2);
      local_90 = auVar9;
      switch(other) {
      case (QRegion *)0x0:
        QRegion::QRegion(&local_98,iVar4,0,iVar2 + iVar4 * -2,iVar5,Rectangle);
        QRegion::operator=((QRegion *)this_00,other);
        QRegion::~QRegion(&local_98);
        break;
      case (QRegion *)0x1:
        QRegion::QRegion(&local_a0,iVar4,iVar3 - iVar5,iVar2 + iVar4 * -2,iVar5,Rectangle);
        QRegion::operator=((QRegion *)this_00,other);
        QRegion::~QRegion(&local_a0);
        break;
      case (QRegion *)0x2:
        QRegion::QRegion(&local_a8,0,iVar4,iVar5,iVar3 + iVar4 * -2,Rectangle);
        QRegion::operator=((QRegion *)this_00,other);
        QRegion::~QRegion(&local_a8);
        break;
      case (QRegion *)0x3:
        QRegion::QRegion(&local_b0,iVar2 - iVar5,iVar4,iVar5,iVar3 + iVar4 * -2,Rectangle);
        QRegion::operator=((QRegion *)this_00,other);
        QRegion::~QRegion(&local_b0);
        break;
      case (QRegion *)0x4:
        QRegion::QRegion(&local_c0,0,0,iVar4,iVar4,Rectangle);
        QRegion::QRegion(&local_c8,iVar5,iVar5,iVar6,iVar6,Rectangle);
        QRegion::operator-(&local_b8,(QRegion *)&local_c0);
        QRegion::operator=((QRegion *)this_00,other);
        QRegion::~QRegion(&local_b8);
        QRegion::~QRegion(&local_c8);
        QRegion::~QRegion(&local_c0);
        break;
      case (QRegion *)0x5:
        QRegion::QRegion(&local_d8,iVar2 - iVar4,0,iVar4,iVar4,Rectangle);
        QRegion::QRegion(&local_e0,iVar2 - iVar4,iVar5,iVar6,iVar6,Rectangle);
        QRegion::operator-(&local_d0,(QRegion *)&local_d8);
        QRegion::operator=((QRegion *)this_00,other);
        QRegion::~QRegion(&local_d0);
        QRegion::~QRegion(&local_e0);
        QRegion::~QRegion(&local_d8);
        break;
      case (QRegion *)0x6:
        QRegion::QRegion(&local_f0,0,iVar3 - iVar4,iVar4,iVar4,Rectangle);
        QRegion::QRegion(&local_f8,iVar5,iVar3 - iVar4,iVar6,iVar6,Rectangle);
        QRegion::operator-(&local_e8,(QRegion *)&local_f0);
        QRegion::operator=((QRegion *)this_00,other);
        QRegion::~QRegion(&local_e8);
        QRegion::~QRegion(&local_f8);
        QRegion::~QRegion(&local_f0);
        break;
      case (QRegion *)0x7:
        QRegion::QRegion(&local_108,iVar2 - iVar4,iVar3 - iVar4,iVar4,iVar4,Rectangle);
        QRegion::QRegion(&local_110,iVar2 - iVar4,iVar3 - iVar4,iVar6,iVar6,Rectangle);
        QRegion::operator-(&local_100,(QRegion *)&local_108);
        QRegion::operator=((QRegion *)this_00,other);
        QRegion::~QRegion(&local_100);
        QRegion::~QRegion(&local_110);
        QRegion::~QRegion(&local_108);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRegion)(QRegionData *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QMdiSubWindowPrivate::getRegion(Operation operation) const
{
    Q_Q(const QMdiSubWindow);
    int width = q->width();
    int height = q->height();
    int titleBarHeight = this->titleBarHeight();
    int frameWidth = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q);
    int cornerConst = titleBarHeight - frameWidth;
    int titleBarConst = 2 * titleBarHeight;

    if (operation == Move) {
        QStyleOptionTitleBar titleBarOptions = this->titleBarOptions();
        QRegion move(frameWidth, frameWidth, width - 2 * frameWidth, cornerConst);
        // Depending on which window flags are set, activated sub controllers will
        // be subtracted from the 'move' region.
        for (int i = 0; i < NumSubControls; ++i) {
            if (SubControls[i] == QStyle::SC_TitleBarLabel)
                continue;
            move -= QRegion(q->style()->subControlRect(QStyle::CC_TitleBar, &titleBarOptions,
                            SubControls[i]));
        }
        return move;
    }

    QRegion region;
    if (isMacStyle(q->style()))
        return region;

    switch (operation) {
    case TopResize:
        region = QRegion(titleBarHeight, 0, width - titleBarConst, frameWidth);
        break;
    case BottomResize:
        region = QRegion(titleBarHeight, height - frameWidth, width - titleBarConst, frameWidth);
        break;
    case LeftResize:
        region = QRegion(0, titleBarHeight, frameWidth, height - titleBarConst);
        break;
    case RightResize:
        region = QRegion(width - frameWidth, titleBarHeight, frameWidth, height - titleBarConst);
        break;
    case TopLeftResize:
        region = QRegion(0, 0, titleBarHeight, titleBarHeight)
                 - QRegion(frameWidth, frameWidth, cornerConst, cornerConst);
        break;
    case TopRightResize:
        region =  QRegion(width - titleBarHeight, 0, titleBarHeight, titleBarHeight)
                  - QRegion(width - titleBarHeight, frameWidth, cornerConst, cornerConst);
        break;
    case BottomLeftResize:
        region = QRegion(0, height - titleBarHeight, titleBarHeight, titleBarHeight)
                 - QRegion(frameWidth, height - titleBarHeight, cornerConst, cornerConst);
        break;
    case BottomRightResize:
        region = QRegion(width - titleBarHeight, height - titleBarHeight, titleBarHeight, titleBarHeight)
                 - QRegion(width - titleBarHeight, height - titleBarHeight, cornerConst, cornerConst);
        break;
    default:
        break;
    }

    return region;
}